

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdEmuCelsiusWeightEnable::emulate_mthd(MthdEmuCelsiusWeightEnable *this)

{
  pgraph_state *state;
  _Bool _Var1;
  uint32_t err;
  bool bVar2;
  
  bVar2 = 1 < (this->super_SingleMthdTest).super_MthdTest.val;
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  _Var1 = pgraph_in_begin_end(state);
  err = bVar2 + 4;
  if (!_Var1) {
    err = (uint32_t)bVar2;
  }
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b =
       ((this->super_SingleMthdTest).super_MthdTest.val & 7) << 0x1a |
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b & 0xe3ffffff;
  pgraph_flush_xf_mode(state);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (val > 1)
			err |= 1;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				insrt(exp.xf_mode_b, 26, 3, val);
				pgraph_flush_xf_mode(&exp);
			}
		}
	}